

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

MemoryLayout * Vector::getElementLayout(MemoryLayout *__return_storage_ptr__,Type *element_t)

{
  MemoryLayout ret;
  Visitor visitor;
  MemoryLayout local_68;
  Visitor local_30 [24];
  
  local_68.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Typelib::MemLayout::Visitor::Visitor(local_30,&local_68,false,false);
  Typelib::TypeVisitor::apply((Type *)local_30);
  Typelib::MemoryLayout::simplify(SUB81(__return_storage_ptr__,0),SUB81(&local_68,0));
  if (local_68.init_ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.init_ops.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MemoryLayout Vector::getElementLayout(Type const& element_t)
{
    try {
        return Typelib::layout_of(element_t);
    }
    catch(std::runtime_error&)
    {
        return MemoryLayout();
    }
}